

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbg.c
# Opt level: O1

void dbgpbval(dbgcxdef *ctx,dattyp typ,uchar *val,_func_void_void_ptr_char_ptr_int *dispfn,
             void *dispctx)

{
  size_t sVar1;
  uint val_00;
  int typ_00;
  uint len;
  char *p;
  char buf [40];
  uint local_64;
  uchar *local_60;
  uchar local_58 [40];
  
  local_60 = local_58;
  switch(typ) {
  case 1:
    sprintf((char *)local_58,"%ld",(long)*(int *)val);
    sVar1 = strlen((char *)local_58);
    local_64 = (uint)sVar1;
    break;
  case 2:
    val_00 = (uint)*(ushort *)val;
    typ_00 = 2;
    goto LAB_00121bea;
  case 3:
    local_64 = *(ushort *)val - 2;
    local_60 = val + 2;
    break;
  default:
    local_60 = "[unknown type]";
    local_64 = 0xe;
    break;
  case 5:
    local_60 = "nil";
    local_64 = 3;
    break;
  case 7:
    (*dispfn)(dispctx,"[",1);
    local_60 = val + 2;
    local_64 = *(ushort *)val - 2;
    if (local_64 != 0) {
      do {
        dbgpbval(ctx,(int)(char)*local_60,local_60 + 1,dispfn,dispctx);
        lstadv(&local_60,&local_64);
        if (local_64 != 0) {
          (*dispfn)(dispctx," ",1);
        }
      } while (local_64 != 0);
    }
    (*dispfn)(dispctx,"]",1);
    local_64 = 0;
    break;
  case 8:
    local_60 = "true";
    local_64 = 4;
    break;
  case 10:
    (*dispfn)(dispctx,"&",1);
    val_00 = (uint)*(ushort *)val;
    typ_00 = 1;
    goto LAB_00121bea;
  case 0xd:
    (*dispfn)(dispctx,"&",1);
    val_00 = (uint)*(ushort *)val;
    typ_00 = 3;
LAB_00121bea:
    local_64 = dbgnam(ctx,(char *)local_58,typ_00,val_00);
  }
  if (typ == 3) {
    (*dispfn)(dispctx,"\'",1);
  }
  if (local_64 != 0) {
    (*dispfn)(dispctx,(char *)local_60,local_64);
  }
  if (typ == 3) {
    (*dispfn)(dispctx,"\'",1);
  }
  return;
}

Assistant:

static void dbgpbval(dbgcxdef *ctx, dattyp typ, uchar *val,
                     void (*dispfn)(void *, const char *, int),
                     void *dispctx)
{
    char  buf[TOKNAMMAX + 1];
    char *p = buf;
    uint  len;

    switch(typ)
    {
    case DAT_NUMBER:
        sprintf(buf, "%ld", (long)osrp4s(val));
        len = strlen(buf);
        break;
        
    case DAT_OBJECT:
        len = dbgnam(ctx, buf, TOKSTOBJ, osrp2(val));
        break;
        
    case DAT_SSTRING:
        len = osrp2(val) - 2;
        p = (char *)val + 2;
        break;
        
    case DAT_NIL:
        p = "nil";
        len = 3;
        break;

    case DAT_LIST:
        (*dispfn)(dispctx, "[", 1);
        len = osrp2(val) - 2;
        p = (char *)val + 2;
        while (len)
        {
            dbgpbval(ctx, (dattyp)*p, (uchar *)(p + 1), dispfn, dispctx);
            lstadv((uchar **)&p, &len);
            if (len) (*dispfn)(dispctx, " ", 1);
        }
        (*dispfn)(dispctx, "]", 1);
        len = 0;
        break;
        
    case DAT_TRUE:
        p = "true";
        len = 4;
        break;
        
    case DAT_FNADDR:
        (*dispfn)(dispctx, "&", 1);
        len = dbgnam(ctx, buf, TOKSTFUNC, osrp2(val));
        break;
        
    case DAT_PROPNUM:
        (*dispfn)(dispctx, "&", 1);
        len = dbgnam(ctx, buf, TOKSTPROP, osrp2(val));
        break;
        
    default:
        p = "[unknown type]";
        len = 14;
        break;
    }

    if (typ == DAT_SSTRING) (*dispfn)(dispctx, "'", 1);
    if (len) (*dispfn)(dispctx, p, len);
    if (typ == DAT_SSTRING) (*dispfn)(dispctx, "'", 1);
}